

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_generator_testing.h
# Opt level: O3

pair<const_phmap::priv::NonStandardLayout,_int> * __thiscall
phmap::priv::hash_internal::Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void>::
operator()(pair<const_phmap::priv::NonStandardLayout,_int> *__return_storage_ptr__,
          Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void> *this)

{
  result_type_conflict1 rVar1;
  mt19937_64 *__urng;
  Generator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  local_71;
  undefined **local_70;
  size_type *local_68;
  size_type local_60;
  size_type local_58;
  undefined8 uStack_50;
  string local_48;
  
  Generator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
  operator()(&local_48,&local_71);
  local_70 = &PTR__NonStandardLayout_00344318;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p == &local_48.field_2) {
    uStack_50 = local_48.field_2._8_8_;
    local_68 = &local_58;
  }
  else {
    local_68 = (size_type *)local_48._M_dataplus._M_p;
  }
  local_58 = local_48.field_2._M_allocated_capacity;
  local_60 = local_48._M_string_length;
  local_48._M_dataplus._M_p = (pointer)0x7fffffff00000000;
  __urng = GetSharedRng();
  rVar1 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)&local_48,__urng,(param_type *)&local_48);
  (__return_storage_ptr__->first)._vptr_NonStandardLayout =
       (_func_int **)&PTR__NonStandardLayout_00344318;
  (__return_storage_ptr__->first).value._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->first).value.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(__return_storage_ptr__->first).value,local_68,(long)local_68 + local_60);
  __return_storage_ptr__->second = rVar1;
  local_70 = &PTR__NonStandardLayout_00344318;
  if (local_68 != &local_58) {
    operator_delete(local_68,local_58 + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<K, V> operator()() const {
        return std::pair<K, V>(Generator<typename std::decay<K>::type>()(),
                               Generator<typename std::decay<V>::type>()());
    }